

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O2

void __thiscall
cmOSXBundleGenerator::CreateAppBundle(cmOSXBundleGenerator *this,string *targetName,string *outpath)

{
  bool bVar1;
  string plist;
  string out;
  string local_40;
  
  bVar1 = MustSkip(this);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&out,(string *)outpath);
    std::__cxx11::string::append((char *)&out);
    cmGeneratorTarget::GetAppBundleDirectory(&plist,this->GT,&this->ConfigName,FullLevel);
    std::__cxx11::string::append((string *)&out);
    std::__cxx11::string::~string((string *)&plist);
    cmsys::SystemTools::MakeDirectory(&out,(mode_t *)0x0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&out);
    std::__cxx11::string::string((string *)&plist,(string *)outpath);
    std::__cxx11::string::append((char *)&plist);
    cmGeneratorTarget::GetAppBundleDirectory(&local_40,this->GT,&this->ConfigName,ContentLevel);
    std::__cxx11::string::append((string *)&plist);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::append((char *)&plist);
    cmLocalGenerator::GenerateAppleInfoPList(this->LocalGenerator,this->GT,targetName,&plist);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&plist);
    std::__cxx11::string::_M_assign((string *)outpath);
    std::__cxx11::string::~string((string *)&plist);
    std::__cxx11::string::~string((string *)&out);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateAppBundle(const std::string& targetName,
                                           std::string& outpath)
{
  if (this->MustSkip()) {
    return;
  }

  // Compute bundle directory names.
  std::string out = outpath;
  out += "/";
  out += this->GT->GetAppBundleDirectory(this->ConfigName,
                                         cmGeneratorTarget::FullLevel);
  cmSystemTools::MakeDirectory(out);
  this->Makefile->AddCMakeOutputFile(out);

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = outpath;
  plist += "/";
  plist += this->GT->GetAppBundleDirectory(this->ConfigName,
                                           cmGeneratorTarget::ContentLevel);
  plist += "/Info.plist";
  this->LocalGenerator->GenerateAppleInfoPList(this->GT, targetName, plist);
  this->Makefile->AddCMakeOutputFile(plist);
  outpath = out;
}